

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O3

void __thiscall cppcms::widgets::numeric<int>::~numeric(numeric<int> *this)

{
  pointer pcVar1;
  
  *(undefined8 *)this = 0x12a2c8;
  *(undefined8 *)&this->field_0x60 = 0x12a358;
  pcVar1 = (this->loaded_string_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->loaded_string_).field_2) {
    operator_delete(pcVar1);
  }
  cppcms::widgets::base_html_input::~base_html_input(&this->super_base_html_input);
  cppcms::widgets::base_widget::~base_widget((base_widget *)&this->field_0x60);
  operator_delete(this);
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}